

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vox2obj.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  ogt_vox_scene *scene;
  size_t sVar6;
  char *__s1;
  int iVar7;
  uint uVar8;
  bool bVar9;
  double dVar10;
  string output_prefix;
  uint32_t local_9c;
  uint32_t local_98;
  float local_94;
  char *local_90;
  char *local_88;
  byte local_78;
  string local_70;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  if (argc == 1) {
    puts(
        "vox2animobj v2.0 by Justin Paver - source code available here: http://github.com/jpaver/opengametools \n\nThis tool can extract frames out of a given MagicaVoxel.vox and save them either as separate .obj files,\n or as a single .obj file with separate internal objects for each frame.\n\n usage: vox2animobj [optional args] <input_file.vox>\n\n [optional args] can be one or multiple of:\n --mesh_algorithm <algo> : (default: polygon) sets the meshing mode where <algo> is one of: simple, greedy or polygon\n --all_frames_in_one     : (default: disabled) specifies that all frames should be written into a single output file\n --output_name <name>    : (default: disabled): name of output files\n --scale <value>         : (default: 1.0): scaling factor to apply to output voxels\n --frames <first> <last> : which frame range to extract. If not specified, will extract all keyframes within the .vox file.\n --output_vox            : (default: disabled): if specified will output .vox files for each frame instead of .obj\nexample:\n  vox2animobj --mesh_algorithm polygon --output_name test --frames 0 119 --scale scene.vox\n\nThe above example uses polygon tessellation. will generate test.mtl/test.tga and the test.obj will contain 120 objects,\nwith each object representing a mesh of the entire frame within scene.vox"
        );
    printf("\n\nPress enter to continue!");
    std::istream::get();
    return 0;
  }
  bVar3 = true;
  if (argc < 2) {
    local_90 = (char *)0x0;
    local_88 = "polygon";
    local_94 = 1.0;
    local_9c = 0xffffffff;
    local_78 = 0;
    bVar2 = false;
    local_98 = 0xffffffff;
    __s1 = (char *)0x0;
    uVar8 = 0;
  }
  else {
    local_98 = 0xffffffff;
    local_94 = 1.0;
    uVar8 = 1;
    local_88 = "polygon";
    bVar2 = false;
    local_9c = 0xffffffff;
    local_78 = 0;
    local_90 = (char *)0x0;
    do {
      __s1 = argv[uVar8];
      iVar4 = strcmp(__s1,"--mesh_algorithm");
      if (iVar4 == 0) {
        local_88 = argv[(ulong)uVar8 + 1];
        goto LAB_001107a3;
      }
      iVar4 = strcmp(__s1,"--all_frames_in_one");
      iVar7 = 1;
      if (iVar4 == 0) {
        local_78 = 1;
      }
      else {
        iVar4 = strcmp(__s1,"--frames");
        if (iVar4 == 0) {
          local_9c = atoi(argv[(ulong)uVar8 + 1]);
          local_98 = atoi(argv[(ulong)uVar8 + 2]);
          iVar7 = 3;
        }
        else {
          iVar4 = strcmp(__s1,"--output_name");
          if (iVar4 == 0) {
            local_90 = argv[(ulong)uVar8 + 1];
          }
          else {
            iVar4 = strcmp(__s1,"--scale");
            if (iVar4 != 0) {
              iVar4 = strcmp(__s1,"--output_vox");
              if (iVar4 == 0) {
                bVar2 = true;
                goto LAB_001107d6;
              }
              iVar4 = strncmp(__s1,"--",2);
              bVar9 = iVar4 == 0;
              if (bVar9) {
                printf("ERROR: unrecognized parameter \'%s\'\n",__s1);
                __s1 = (char *)0x0;
              }
              bVar3 = !bVar9;
              uVar8 = (uint)bVar9;
              goto LAB_00110859;
            }
            dVar10 = atof(argv[(ulong)uVar8 + 1]);
            local_94 = (float)dVar10;
          }
LAB_001107a3:
          iVar7 = 2;
        }
      }
LAB_001107d6:
      uVar8 = uVar8 + iVar7;
    } while ((int)uVar8 < argc);
    __s1 = (char *)0x0;
    uVar8 = 0;
    bVar3 = true;
  }
LAB_00110859:
  if (!bVar3) {
    return uVar8;
  }
  if (__s1 == (char *)0x0) {
    puts("ERROR: expected last argument to be input file");
    puts(
        "vox2animobj v2.0 by Justin Paver - source code available here: http://github.com/jpaver/opengametools \n\nThis tool can extract frames out of a given MagicaVoxel.vox and save them either as separate .obj files,\n or as a single .obj file with separate internal objects for each frame.\n\n usage: vox2animobj [optional args] <input_file.vox>\n\n [optional args] can be one or multiple of:\n --mesh_algorithm <algo> : (default: polygon) sets the meshing mode where <algo> is one of: simple, greedy or polygon\n --all_frames_in_one     : (default: disabled) specifies that all frames should be written into a single output file\n --output_name <name>    : (default: disabled): name of output files\n --scale <value>         : (default: 1.0): scaling factor to apply to output voxels\n --frames <first> <last> : which frame range to extract. If not specified, will extract all keyframes within the .vox file.\n --output_vox            : (default: disabled): if specified will output .vox files for each frame instead of .obj\nexample:\n  vox2animobj --mesh_algorithm polygon --output_name test --frames 0 119 --scale scene.vox\n\nThe above example uses polygon tessellation. will generate test.mtl/test.tga and the test.obj will contain 120 objects,\nwith each object representing a mesh of the entire frame within scene.vox"
        );
    return 1;
  }
  scene = load_vox_scene(__s1,0xf);
  if (scene == (ogt_vox_scene *)0x0) {
    printf("ERROR: could not load input file: %s",__s1);
    return 3;
  }
  paVar1 = &local_70.field_2;
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  local_70._M_dataplus._M_p = (pointer)paVar1;
  if (local_90 == (char *)0x0) {
    local_50[0] = local_40;
    sVar6 = strlen(__s1);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_50,__s1,__s1 + sVar6);
    std::__cxx11::string::operator=((string *)&local_70,(string *)local_50);
    if (local_50[0] != local_40) {
      operator_delete(local_50[0]);
    }
    std::__cxx11::string::find((char)&local_70,0x2e);
    std::__cxx11::string::substr((ulong)local_50,(ulong)&local_70);
  }
  else {
    local_50[0] = local_40;
    sVar6 = strlen(local_90);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_50,local_90,local_90 + sVar6);
  }
  std::__cxx11::string::operator=((string *)&local_70,(string *)local_50);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  if (bVar2) {
    bVar3 = export_scene_anim_as_vox(scene,&local_70,local_9c,local_98);
    uVar5 = (uint)bVar3;
  }
  else {
    iVar4 = strcmp(local_88,"polygon");
    if (((iVar4 == 0) || (iVar4 = strcmp(local_88,"greedy"), iVar4 == 0)) ||
       (iVar4 = strcmp(local_88,"simple"), iVar4 == 0)) {
      bVar3 = export_scene_anim_as_obj
                        (scene,&local_70,(bool)(local_78 ^ 1),local_94,local_9c,local_98,local_88);
      uVar5 = (uint)bVar3;
      bVar3 = true;
    }
    else {
      bVar3 = false;
      printf("ERROR: invalid mesh algorithm specified: %s",local_88);
      puts(
          "vox2animobj v2.0 by Justin Paver - source code available here: http://github.com/jpaver/opengametools \n\nThis tool can extract frames out of a given MagicaVoxel.vox and save them either as separate .obj files,\n or as a single .obj file with separate internal objects for each frame.\n\n usage: vox2animobj [optional args] <input_file.vox>\n\n [optional args] can be one or multiple of:\n --mesh_algorithm <algo> : (default: polygon) sets the meshing mode where <algo> is one of: simple, greedy or polygon\n --all_frames_in_one     : (default: disabled) specifies that all frames should be written into a single output file\n --output_name <name>    : (default: disabled): name of output files\n --scale <value>         : (default: 1.0): scaling factor to apply to output voxels\n --frames <first> <last> : which frame range to extract. If not specified, will extract all keyframes within the .vox file.\n --output_vox            : (default: disabled): if specified will output .vox files for each frame instead of .obj\nexample:\n  vox2animobj --mesh_algorithm polygon --output_name test --frames 0 119 --scale scene.vox\n\nThe above example uses polygon tessellation. will generate test.mtl/test.tga and the test.obj will contain 120 objects,\nwith each object representing a mesh of the entire frame within scene.vox"
          );
      uVar8 = 2;
      uVar5 = 0;
    }
    if (!bVar3) goto LAB_00110a50;
  }
  ogt_vox_destroy_scene(scene);
  uVar8 = uVar5 << 2;
LAB_00110a50:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  return uVar8;
}

Assistant:

int main(int argc, char** argv) {
    // print help if no args are provided
    if (argc == 1) {
        print_help();
        // wait for keyboard input
        printf("\n\nPress enter to continue!");
        std::cin.get();

        return 0;
    }

    // default parameter values
    const char* input_file        = nullptr;
    const char* mesh_algorithm    = "polygon";
    const char* output_name       = nullptr;
    bool        all_frames_in_one = false;
    bool        output_as_vox     = false;
    uint32_t    frame_min         = UINT32_MAX; // auto!
    uint32_t    frame_max         = UINT32_MAX; // auto!
    float       scale             = 1.0f;

    // parse arguments and override default parameter values
    for (int i = 1; i < argc; ) {
        if (strcmp(argv[i], "--mesh_algorithm")==0) {
            mesh_algorithm = argv[i+1];
            i += 2;
        }
        else if (strcmp(argv[i], "--all_frames_in_one") == 0) {
            all_frames_in_one = true;
            i++;
        }
        else if (strcmp(argv[i], "--frames") == 0) {
            frame_min = atoi(argv[i+1]);
            frame_max = atoi(argv[i+2]);
            i += 3;
        }
        else if (strcmp(argv[i], "--output_name") == 0) {
            output_name = argv[i+1];
            i += 2;
        }
        else if (strcmp(argv[i], "--scale") == 0) {
            scale = (float)atof(argv[i+1]);
            i += 2;
        }
        else if (strcmp(argv[i], "--output_vox") == 0) {
            output_as_vox = true;
            i++;
        }
        else if (strncmp(argv[i], "--", 2) == 0) {
            printf("ERROR: unrecognized parameter '%s'\n", argv[i]);
            return 1;
        }
        else {
            input_file = argv[i];
            break;
        }
    }

    // validate that an input file was specified.
    if (!input_file) {
        printf("ERROR: expected last argument to be input file\n");
        print_help();
        return 1;
    }

    uint32_t read_scene_flags = k_read_scene_flags_keyframes | k_read_scene_flags_groups | k_read_scene_flags_keep_empty_models_instances | k_read_scene_flags_keep_duplicate_models;

    const ogt_vox_scene* scene = load_vox_scene(input_file, read_scene_flags);
    if (!scene) {
        printf("ERROR: could not load input file: %s", input_file);
        return 3;
    }

    // either use the output prefix specified, or generate one from the input filename.
    std::string output_prefix;
    if (!output_name) {
        output_prefix = std::string(input_file);
        output_prefix = output_prefix.substr(0, output_prefix.find_first_of('.'));
    }
    else {
        output_prefix = std::string(output_name);
    }

    bool ret = false;
    if (output_as_vox) {
        ret = export_scene_anim_as_vox(scene, output_prefix, frame_min, frame_max);
    }
    else {
        bool output_file_per_frame = !all_frames_in_one;
        // validate specified mesh_algorithm is one of "polygon", "greedy" or "simple"
        if (strcmp(mesh_algorithm, "polygon") != 0 &&
            strcmp(mesh_algorithm, "greedy") != 0 &&
            strcmp(mesh_algorithm, "simple") != 0)
        {
            printf("ERROR: invalid mesh algorithm specified: %s", mesh_algorithm);
            print_help();
            return 2;
        }
        ret = export_scene_anim_as_obj(scene, output_prefix, output_file_per_frame, scale, frame_min, frame_max, mesh_algorithm);
    }
    ogt_vox_destroy_scene(scene);

    return ret ? 4 : 0;
}